

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,object_literal_expression *e)

{
  wostream *pwVar1;
  long *plVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 in_RAX;
  pointer ppVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  undefined8 local_38;
  
  pwVar1 = this->os_;
  plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
  local_38 = in_RAX;
  if (plVar2 != (long *)0x0) {
    uVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,0x7b);
    local_38 = CONCAT44(local_38._4_4_,uVar3);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,(wchar_t *)&local_38,1);
    ppVar5 = (e->elements_).
             super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((e->elements_).
        super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        if (*(int *)((long)&ppVar5->type_ + lVar8) == 0) {
          pcVar7 = "], ";
          if (uVar6 == 0) {
            pcVar7 = "\t";
          }
          std::operator<<(this->os_,pcVar7 + 1);
          accept<mjs::print_visitor>
                    (*(expression **)
                      ((long)&(((e->elements_).
                                super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name_)._M_t.
                              super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                      + lVar8),this);
          std::operator<<(this->os_,": ");
          accept<mjs::print_visitor>
                    (*(expression **)
                      ((long)&(((e->elements_).
                                super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                              super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                      + lVar8),this);
        }
        else {
          pcVar7 = ",";
          if (uVar6 == 0) {
            pcVar7 = "";
          }
          std::operator<<(this->os_,pcVar7);
          plVar2 = *(long **)((long)&(((e->elements_).
                                       super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                                     super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                             + lVar8);
          iVar4 = (**(code **)(*plVar2 + 0x18))(plVar2);
          if (iVar4 != 0xb) {
            __assert_fail("f.type() == expression_type::function",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                          ,0x3c,
                          "void mjs::print_visitor::operator()(const object_literal_expression &)");
          }
          handle_function(this,(function_base *)(plVar2 + 4));
        }
        uVar6 = uVar6 + 1;
        ppVar5 = (e->elements_).
                 super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x18;
      } while (uVar6 < (ulong)(((long)(e->elements_).
                                      super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 3
                               ) * -0x5555555555555555));
    }
    pwVar1 = this->os_;
    plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      uVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,0x7d);
      local_38 = CONCAT44(uVar3,(wchar_t)local_38);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar1,(wchar_t *)((long)&local_38 + 4),1);
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const object_literal_expression& e) {
        os_ << '{';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            if (es[i].type() == property_assignment_type::normal) {
                os_ << (i ? ", " : "");
                accept(es[i].name(), *this);
                os_ << ": ";
                accept(es[i].value(), *this);
            } else {
                os_ << (i ? "," : "");
                const auto& f = es[i].value();
                assert(f.type() == expression_type::function);
                handle_function(static_cast<const function_expression&>(f));
            }
        }
        os_ << '}';
    }